

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O3

void __thiscall
sznet::net::KcpTcpEventLoopThreadPool::start(KcpTcpEventLoopThreadPool *this,ThreadInitCallback *cb)

{
  pointer *pppKVar1;
  size_t *psVar2;
  undefined8 *puVar3;
  KcpTcpEventLoop *this_00;
  pointer pIVar4;
  iterator __position;
  size_t sVar5;
  undefined8 uVar6;
  InetAddress m_udpLisetenAddr;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  KcpTcpEventLoopThread *this_01;
  ulong uVar11;
  long lVar12;
  undefined1 local_1450 [8];
  random_device rd;
  InetAddress addr;
  undefined4 uStack_a0;
  undefined1 local_88 [8];
  vector<char,_std::allocator<char>_> vbuf;
  undefined1 local_60 [32];
  _Any_data *local_40;
  int local_38;
  allocator local_31;
  
  local_40 = (_Any_data *)cb;
  if (this->m_started == true) {
    __assert_fail("!m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                  ,0x1f,
                  "void sznet::net::KcpTcpEventLoopThreadPool::start(const ThreadInitCallback &)");
  }
  if (((long)(this->m_udpListenAddrs).
             super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_udpListenAddrs).
             super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>.
             _M_impl.super__Vector_impl_data._M_start >> 2) * 0x6db6db6db6db6db7 -
      (long)this->m_numThreads == 0) {
    this_00 = this->m_baseLoop;
    bVar8 = EventLoop::isInLoopThread(&this_00->super_EventLoop);
    if (!bVar8) {
      EventLoop::abortNotInLoopThread(&this_00->super_EventLoop);
    }
    this->m_started = true;
    std::random_device::random_device((random_device *)local_1450);
    iVar9 = std::random_device::_M_getval();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_88,
               (this->m_name)._M_string_length + 0x20,(allocator_type *)local_60);
    iVar10 = this->m_numThreads;
    if (0 < iVar10) {
      vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)&this->m_threads;
      lVar12 = 0;
      uVar11 = 0;
      local_38 = iVar9;
      do {
        snprintf((char *)local_88,
                 (long)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start - (long)local_88,"%s%d",
                 (this->m_name)._M_dataplus._M_p,uVar11 & 0xffffffff);
        pIVar4 = (this->m_udpListenAddrs).
                 super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar2 = (size_t *)((long)&pIVar4->field_0 + lVar12);
        rd.field_0._M_mt._M_p = *psVar2;
        sVar5 = psVar2[1];
        puVar3 = (undefined8 *)((long)&pIVar4->field_0 + lVar12 + 0xc);
        uVar6 = puVar3[1];
        addr.field_0._8_4_ = (undefined4)((ulong)*puVar3 >> 0x20);
        addr.field_0.m_addr6.sin6_flowinfo = (uint32_t)(sVar5 >> 0x20);
        this_01 = (KcpTcpEventLoopThread *)operator_new(0x1b0);
        uVar7 = rd.field_0._M_mt._M_p;
        uStack_a0 = (undefined4)sVar5;
        std::__cxx11::string::string((string *)local_60,(char *)local_88,&local_31);
        local_38 = local_38 + (int)uVar11;
        m_udpLisetenAddr.field_0._8_4_ = uStack_a0;
        m_udpLisetenAddr.field_0._0_8_ = uVar7;
        m_udpLisetenAddr.field_0._12_4_ = addr.field_0.m_addr6.sin6_flowinfo;
        m_udpLisetenAddr.field_0._16_4_ = addr.field_0._8_4_;
        m_udpLisetenAddr.field_0._20_8_ = uVar6;
        KcpTcpEventLoopThread::KcpTcpEventLoopThread
                  (this_01,m_udpLisetenAddr,(ThreadInitCallback *)local_40,(string *)local_60,
                   local_38);
        if ((KcpTcpEventLoop *)local_60._0_8_ != (KcpTcpEventLoop *)(local_60 + 0x10)) {
          operator_delete((void *)local_60._0_8_);
        }
        local_60._0_8_ = this_01;
        std::
        vector<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>>>
        ::
        emplace_back<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>>
                  ((vector<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>,std::allocator<std::unique_ptr<sznet::net::KcpTcpEventLoopThread,std::default_delete<sznet::net::KcpTcpEventLoopThread>>>>
                    *)vbuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                   (unique_ptr<sznet::net::KcpTcpEventLoopThread,_std::default_delete<sznet::net::KcpTcpEventLoopThread>_>
                    *)local_60);
        uVar6 = local_60._0_8_;
        if ((KcpTcpEventLoopThread *)local_60._0_8_ != (KcpTcpEventLoopThread *)0x0) {
          KcpTcpEventLoopThread::~KcpTcpEventLoopThread((KcpTcpEventLoopThread *)local_60._0_8_);
          operator_delete((void *)uVar6);
        }
        local_60._0_8_ = KcpTcpEventLoopThread::startLoop(this_01);
        __position._M_current =
             (this->m_loops).
             super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_loops).
            super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<sznet::net::KcpTcpEventLoop*,std::allocator<sznet::net::KcpTcpEventLoop*>>::
          _M_realloc_insert<sznet::net::KcpTcpEventLoop*>
                    ((vector<sznet::net::KcpTcpEventLoop*,std::allocator<sznet::net::KcpTcpEventLoop*>>
                      *)&this->m_loops,__position,(KcpTcpEventLoop **)local_60);
        }
        else {
          *__position._M_current = (KcpTcpEventLoop *)local_60._0_8_;
          pppKVar1 = &(this->m_loops).
                      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppKVar1 = *pppKVar1 + 1;
        }
        iVar10 = this->m_numThreads;
        uVar11 = uVar11 + 1;
        lVar12 = lVar12 + 0x1c;
      } while ((long)uVar11 < (long)iVar10);
    }
    if ((iVar10 == 0) && (*(long *)(local_40 + 1) != 0)) {
      local_60._0_8_ = this->m_baseLoop;
      (**(code **)((long)local_40 + 0x18))(local_40,(KcpTcpEventLoop **)local_60);
    }
    if (local_88 != (undefined1  [8])0x0) {
      operator_delete((void *)local_88);
    }
    std::random_device::_M_fini();
    return;
  }
  __assert_fail("m_numThreads == m_udpListenAddrs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                ,0x20,
                "void sznet::net::KcpTcpEventLoopThreadPool::start(const ThreadInitCallback &)");
}

Assistant:

void KcpTcpEventLoopThreadPool::start(const ThreadInitCallback& cb)
{
	assert(!m_started);
	assert(m_numThreads == m_udpListenAddrs.size()),
		m_baseLoop->assertInLoopThread();
	m_started = true;
	std::random_device rd;
	int initSeed = rd();

	std::vector<char> vbuf(m_name.size() + 32);
	for (int i = 0; i < m_numThreads; ++i)
	{
		snprintf(vbuf.data(), vbuf.size(), "%s%d", m_name.c_str(), i);
		InetAddress addr = m_udpListenAddrs[i];
		initSeed = initSeed + i;
		KcpTcpEventLoopThread* t = new KcpTcpEventLoopThread(addr, cb, vbuf.data(), initSeed);
		m_threads.push_back(std::unique_ptr<KcpTcpEventLoopThread>(t));
		// 阻塞
		// 启动EventLoopThread线程，在进入事件循环之前，会调用cb
		m_loops.push_back(t->startLoop());
	}
	// 只有一个EventLoop，在这个EventLoop进入事件循环之前，调用cb
	if (m_numThreads == 0 && cb)
	{
		cb(m_baseLoop);
	}
}